

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

void __thiscall QPainterPath::moveTo(QPainterPath *this,QPointF *p)

{
  long lVar1;
  QPointF p_00;
  bool bVar2;
  QPainterPathPrivate *pQVar3;
  Element *pEVar4;
  qsizetype qVar5;
  QPointF *in_RSI;
  long in_FS_OFFSET;
  qreal qVar6;
  QPainterPathPrivate *d;
  Element elm;
  parameter_type in_stack_ffffffffffffff98;
  QList<QPainterPath::Element> *in_stack_ffffffffffffffa0;
  qreal in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_00.yp = in_stack_ffffffffffffffa8;
  p_00.xp = (qreal)in_stack_ffffffffffffffa0;
  bVar2 = hasValidCoords(p_00);
  if (bVar2) {
    ensureData((QPainterPath *)in_stack_ffffffffffffffa0);
    detach((QPainterPath *)in_stack_ffffffffffffffa0);
    pQVar3 = d_func((QPainterPath *)0x5b6958);
    pQVar3->field_0x84 = pQVar3->field_0x84 & 0xfe;
    pEVar4 = QList<QPainterPath::Element>::constLast
                       ((QList<QPainterPath::Element> *)in_stack_ffffffffffffff98);
    if (pEVar4->type == MoveToElement) {
      qVar6 = QPointF::x(in_RSI);
      pEVar4 = QList<QPainterPath::Element>::last
                         ((QList<QPainterPath::Element> *)in_stack_ffffffffffffff98);
      pEVar4->x = qVar6;
      qVar6 = QPointF::y(in_RSI);
      pEVar4 = QList<QPainterPath::Element>::last
                         ((QList<QPainterPath::Element> *)in_stack_ffffffffffffff98);
      pEVar4->y = qVar6;
    }
    else {
      QPointF::x(in_RSI);
      QPointF::y(in_RSI);
      QList<QPainterPath::Element>::append(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    qVar5 = QList<QPainterPath::Element>::size(&pQVar3->elements);
    pQVar3->cStart = (int)qVar5 + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainterPath::moveTo(const QPointF &p)
{
#ifdef QPP_DEBUG
    printf("QPainterPath::moveTo() (%.2f,%.2f)\n", p.x(), p.y());
#endif

    if (!hasValidCoords(p)) {
#ifndef QT_NO_DEBUG
        qWarning("QPainterPath::moveTo: Adding point with invalid coordinates, ignoring call");
#endif
        return;
    }

    ensureData();
    detach();

    QPainterPathPrivate *d = d_func();
    Q_ASSERT(!d->elements.isEmpty());

    d->require_moveTo = false;

    if (d->elements.constLast().type == MoveToElement) {
        d->elements.last().x = p.x();
        d->elements.last().y = p.y();
    } else {
        Element elm = { p.x(), p.y(), MoveToElement };
        d->elements.append(elm);
    }
    d->cStart = d->elements.size() - 1;
}